

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O2

void __thiscall luna::State::CallCFunction(State *this,Value *f,int expect_result)

{
  CFunctionType p_Var1;
  anon_union_8_9_8deb4486_for_Value_0 *paVar2;
  uint uVar3;
  int iVar4;
  Value *pVVar5;
  Value *pVVar6;
  uint uVar7;
  bool bVar8;
  CallInfo callee;
  CallInfo local_50;
  
  CallInfo::CallInfo(&local_50);
  local_50.register_ = f + 1;
  local_50.func_ = f;
  local_50.expect_result_ = expect_result;
  std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::push_back
            (&this->calls_,&local_50);
  p_Var1 = (f->field_0).cfunc_;
  (this->cfunc_error_).type_ = CFuntionErrorType_NoError;
  uVar3 = (*p_Var1)(this);
  CheckCFunctionError(this);
  pVVar5 = (Value *)0x0;
  pVVar6 = (this->stack_).top_ + -(ulong)uVar3;
  if ((int)uVar3 < 1) {
    pVVar6 = pVVar5;
  }
  if (expect_result == -1) {
    if (0 < (int)uVar3) {
      pVVar5 = (Value *)(ulong)uVar3;
    }
    while (iVar4 = (int)pVVar5, pVVar5 = (Value *)(ulong)(iVar4 - 1), iVar4 != 0) {
      f->type_ = pVVar6->type_;
      paVar2 = &pVVar6->field_0;
      pVVar6 = pVVar6 + 1;
      f->field_0 = *paVar2;
      f = f + 1;
    }
  }
  else {
    uVar7 = expect_result;
    if ((int)uVar3 < expect_result) {
      uVar7 = uVar3;
    }
    if (0 < (int)uVar7) {
      pVVar5 = (Value *)(ulong)uVar7;
    }
    while (iVar4 = (int)pVVar5, pVVar5 = (Value *)(ulong)(iVar4 - 1), iVar4 != 0) {
      f->type_ = pVVar6->type_;
      paVar2 = &pVVar6->field_0;
      pVVar6 = pVVar6 + 1;
      f->field_0 = *paVar2;
      f = f + 1;
    }
    iVar4 = 0;
    if (0 < (int)(expect_result - uVar3)) {
      iVar4 = expect_result - uVar3;
    }
    while (bVar8 = iVar4 != 0, iVar4 = iVar4 + -1, bVar8) {
      (f->field_0).obj_ = (GCObject *)0x0;
      f->type_ = ValueT_Nil;
      f = f + 1;
    }
  }
  Stack::SetNewTop(&this->stack_,f);
  std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::pop_back(&this->calls_);
  return;
}

Assistant:

void State::CallCFunction(Value *f, int expect_result)
    {
        // Push the c function CallInfo
        CallInfo callee;
        callee.register_ = f + 1;
        callee.func_ = f;
        callee.expect_result_ = expect_result;
        calls_.push_back(callee);

        // Call c function
        CFunctionType cfunc = f->cfunc_;
        ClearCFunctionError();
        int res_count = cfunc(this);
        CheckCFunctionError();

        Value *src = nullptr;
        if (res_count > 0)
            src = stack_.top_ - res_count;

        // Copy c function result to caller stack
        Value *dst = f;
        if (expect_result == EXP_VALUE_COUNT_ANY)
        {
            for (int i = 0; i < res_count; ++i)
                *dst++ = *src++;
        }
        else
        {
            int count = std::min(expect_result, res_count);
            for (int i = 0; i < count; ++i)
                *dst++ = *src++;
            // Set all remain expect results to nil
            count = expect_result - res_count;
            for (int i = 0; i < count; ++i, ++dst)
                dst->SetNil();
        }

        // Set registers which after dst to nil
        // and set new stack top pointer
        stack_.SetNewTop(dst);

        // Pop the c function CallInfo
        calls_.pop_back();
    }